

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialog::setMimeTypeFilters(QFileDialog *this,QStringList *filters)

{
  long lVar1;
  QStringList *__range1;
  long lVar2;
  QString *mimeType;
  QString *mimeType_00;
  long in_FS_OFFSET;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  lVar2 = (filters->d).size;
  if (lVar2 != 0) {
    mimeType_00 = (filters->d).ptr;
    lVar2 = lVar2 * 0x18;
    do {
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      nameFilterForMime(&local_78,mimeType_00);
      if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      mimeType_00 = mimeType_00 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  setNameFilters(this,(QStringList *)&local_58);
  QFileDialogOptions::setMimeTypeFilters(*(QList_conflict **)(lVar1 + 0x3d0));
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setMimeTypeFilters(const QStringList &filters)
{
    Q_D(QFileDialog);
    QStringList nameFilters;
    for (const QString &mimeType : filters) {
        const QString text = nameFilterForMime(mimeType);
        if (!text.isEmpty())
            nameFilters.append(text);
    }
    setNameFilters(nameFilters);
    d->options->setMimeTypeFilters(filters);
}